

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_features.c
# Opt level: O3

LY_ERR lys_eval_iffeatures(ly_ctx *ctx,lysp_qname *iffeatures,ly_bool *enabled)

{
  LY_ERR LVar1;
  lysp_qname *qname;
  ulong uVar2;
  lysc_iffeature iff;
  size_t index_e;
  lysc_iffeature local_88;
  ly_bool *local_70;
  ly_ctx *local_68;
  size_t local_60 [2];
  lysf_ctx local_50;
  
  local_50.mod = (lys_module *)0x0;
  local_50.ext_set.size = 0;
  local_50.ext_set.count = 0;
  local_50.ext_set.field_2.dnodes = (lyd_node **)0x0;
  *enabled = '\x01';
  if ((iffeatures != (lysp_qname *)0x0) && (*(long *)&iffeatures[-1].flags != 0)) {
    uVar2 = 0;
    qname = iffeatures;
    local_70 = enabled;
    local_68 = ctx;
    local_50.ctx = ctx;
    do {
      local_88.expr = (uint8_t *)0x0;
      local_88.features = (lysp_feature **)0x0;
      LVar1 = lys_compile_iffeature(local_68,qname,&local_88);
      if (LVar1 != LY_SUCCESS) {
        return LVar1;
      }
      local_60[1] = 0;
      local_60[0] = 0;
      if (local_88.expr == (uint8_t *)0x0) {
        lysc_iffeature_free(&local_50,&local_88);
LAB_0015344e:
        *local_70 = '\0';
        return LY_SUCCESS;
      }
      LVar1 = lysc_iffeature_value_(&local_88,local_60 + 1,local_60);
      lysc_iffeature_free(&local_50,&local_88);
      if (LVar1 != LY_SUCCESS) {
        if (LVar1 != LY_ENOT) {
          return LVar1;
        }
        goto LAB_0015344e;
      }
      uVar2 = uVar2 + 1;
      qname = qname + 1;
    } while (uVar2 < *(ulong *)&iffeatures[-1].flags);
  }
  return LY_SUCCESS;
}

Assistant:

LY_ERR
lys_eval_iffeatures(const struct ly_ctx *ctx, const struct lysp_qname *iffeatures, ly_bool *enabled)
{
    LY_ERR ret;
    LY_ARRAY_COUNT_TYPE u;
    struct lysc_iffeature iff;
    struct lysf_ctx fctx = {.ctx = (struct ly_ctx *)ctx};

    /* enabled by default */
    *enabled = 1;

    if (!iffeatures) {
        return LY_SUCCESS;
    }

    /* evaluate all if-feature conditions or until an unsatisfied one is found */
    LY_ARRAY_FOR(iffeatures, u) {
        memset(&iff, 0, sizeof iff);
        LY_CHECK_RET(lys_compile_iffeature(ctx, &iffeatures[u], &iff));

        ret = lysc_iffeature_value(&iff);
        lysc_iffeature_free(&fctx, &iff);
        if (ret == LY_ENOT) {
            *enabled = 0;
            break;
        } else if (ret) {
            return ret;
        }
    }

    return LY_SUCCESS;
}